

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O2

void * deMemPool_alignedAlloc(deMemPool *pool,size_t numBytes,deUint32 alignBytes)

{
  deMemPoolUtil *pdVar1;
  void *pvVar2;
  
  pvVar2 = deMemPool_allocInternal(pool,numBytes,alignBytes);
  if ((pvVar2 == (void *)0x0) && (pdVar1 = pool->util, pdVar1 != (deMemPoolUtil *)0x0)) {
    (*pdVar1->allocFailCallback)(pdVar1->userPointer);
  }
  return pvVar2;
}

Assistant:

void* deMemPool_alignedAlloc (deMemPool* pool, size_t numBytes, deUint32 alignBytes)
{
	void* ptr;
	DE_ASSERT(pool);
	DE_ASSERT(numBytes > 0);
	DE_ASSERT(deIsPowerOfTwo32((int)alignBytes));
	ptr = deMemPool_allocInternal(pool, numBytes, alignBytes);
	DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));
	if (!ptr && pool->util)
		pool->util->allocFailCallback(pool->util->userPointer);
	return ptr;
}